

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_get_any_asn1(CBS *cbs,CBS *out,CBS_ASN1_TAG *out_tag)

{
  int iVar1;
  size_t header_len;
  
  iVar1 = CBS_get_any_asn1_element(cbs,out,out_tag,&header_len);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    if (out != (CBS *)0x0) {
      if (out->len < header_len) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                      ,0x19e,"int CBS_get_any_asn1(CBS *, CBS *, CBS_ASN1_TAG *)");
      }
      out->data = out->data + header_len;
      out->len = out->len - header_len;
    }
  }
  return iVar1;
}

Assistant:

int CBS_get_any_asn1(CBS *cbs, CBS *out, CBS_ASN1_TAG *out_tag) {
  size_t header_len;
  if (!CBS_get_any_asn1_element(cbs, out, out_tag, &header_len)) {
    return 0;
  }

  if (out && !CBS_skip(out, header_len)) {
    assert(0);
    return 0;
  }

  return 1;
}